

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ThreadSafeArena::AddSerialArena
          (ThreadSafeArena *this,void *id,SerialArena *serial)

{
  bool bVar1;
  uint32_t prev_capacity;
  SerialArenaChunk *pSVar2;
  SerialArenaChunkHeader *pSVar3;
  SerialArenaChunk *this_00;
  MutexLock lock;
  MutexLock local_30;
  
  this_00 = (this->head_)._M_b._M_p;
  bVar1 = SerialArenaChunk::IsSentry(this_00);
  if ((!bVar1) && (bVar1 = SerialArenaChunk::insert(this_00,id,serial), bVar1)) {
    return;
  }
  local_30.mu_ = &this->mutex_;
  absl::lts_20240722::Mutex::Lock();
  pSVar2 = (this->head_)._M_b._M_p;
  if ((pSVar2 == this_00) ||
     (bVar1 = SerialArenaChunk::insert(pSVar2,id,serial), this_00 = pSVar2, !bVar1)) {
    prev_capacity = SerialArenaChunk::capacity(this_00);
    pSVar2 = NewSerialArenaChunk(prev_capacity,id,serial);
    pSVar3 = SerialArenaChunk::header(pSVar2);
    pSVar3->next_chunk = this_00;
    (this->head_)._M_b._M_p = pSVar2;
  }
  absl::lts_20240722::MutexLock::~MutexLock(&local_30);
  return;
}

Assistant:

void ThreadSafeArena::AddSerialArena(void* id, SerialArena* serial) {
  SerialArenaChunk* head = head_.load(std::memory_order_acquire);
  // Fast path without acquiring mutex.
  if (!head->IsSentry() && head->insert(id, serial)) {
    return;
  }

  // Slow path with acquiring mutex.
  absl::MutexLock lock(&mutex_);

  // Refetch and if someone else installed a new head, try allocating on that!
  SerialArenaChunk* new_head = head_.load(std::memory_order_acquire);
  if (new_head != head) {
    if (new_head->insert(id, serial)) return;
    // Update head to link to the latest one.
    head = new_head;
  }

  new_head = NewSerialArenaChunk(head->capacity(), id, serial);
  new_head->set_next(head);

  // Use "std::memory_order_release" to make sure prior stores are visible after
  // this one.
  head_.store(new_head, std::memory_order_release);
}